

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_nginx.c
# Opt level: O0

int log_policy_stream_nginx_create(log_policy policy,log_policy_ctor ctor)

{
  long *instance;
  long *in_RSI;
  log_policy in_RDI;
  log_policy_stream_nginx_ctor nginx_ctor;
  log_policy_stream_nginx_data nginx_data;
  int local_4;
  
  if ((*in_RSI == 0) || (in_RSI[1] == 0)) {
    local_4 = 1;
  }
  else {
    instance = (long *)malloc(0x18);
    if (instance == (long *)0x0) {
      local_4 = 1;
    }
    else {
      *instance = *in_RSI;
      instance[1] = in_RSI[1];
      *(short *)(instance + 2) = (short)in_RSI[2];
      log_policy_instantiate(in_RDI,instance,1);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int log_policy_stream_nginx_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_stream_nginx_data nginx_data = NULL;

	const log_policy_stream_nginx_ctor nginx_ctor = ctor;

	if (nginx_ctor->ngx_log_ptr == NULL || nginx_ctor->ngx_error_ptr == NULL)
	{
		return 1;
	}

	nginx_data = malloc(sizeof(struct log_policy_stream_nginx_data_type));

	if (nginx_data == NULL)
	{
		return 1;
	}

	nginx_data->ngx_log_ptr = nginx_ctor->ngx_log_ptr;

	nginx_data->ngx_error_ptr = (log_policy_stream_nginx_error)nginx_ctor->ngx_error_ptr;

	nginx_data->ngx_log_level = nginx_ctor->ngx_log_level;

	log_policy_instantiate(policy, nginx_data, LOG_POLICY_STREAM_NGINX);

	return 0;
}